

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid>::~TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPyramid> *this)

{
  ~TPZMultiphysicsCompEl(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::~TPZMultiphysicsCompEl(){
    int nc = NConnects();
    for (int ic=0; ic<nc; ic++) {
        Connect(ic).RemoveDepend();
    }
}